

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O3

void __thiscall
TPZMatrix<std::complex<long_double>_>::MultiplyByScalar
          (TPZMatrix<std::complex<long_double>_> *this,complex<long_double> alpha,
          TPZMatrix<std::complex<long_double>_> *res)

{
  int iVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  TPZFMatrixRef<std::complex<long_double>_> ref;
  TPZFMatrixRef<std::complex<long_double>_> local_a8;
  
  (*(res->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x1f])(res,this);
  iVar1 = (*(res->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x4b])(res);
  (*(res->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x4c])(res);
  iVar2 = (*(res->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x4c])(res);
  TPZFMatrixRef<std::complex<long_double>_>::TPZFMatrixRef
            (&local_a8,CONCAT44(extraout_var,iVar1),
             (complex<long_double> **)CONCAT44(extraout_var_00,iVar2));
  TPZFMatrix<std::complex<long_double>_>::operator*=
            (&local_a8.super_TPZFMatrix<std::complex<long_double>_>,alpha);
  TPZFMatrixRef<std::complex<long_double>_>::~TPZFMatrixRef
            (&local_a8,&TPZFMatrixRef<std::complex<long_double>>::VTT);
  return;
}

Assistant:

void TPZMatrix<TVar>::MultiplyByScalar(const TVar alpha, TPZMatrix<TVar>&res) const
{
  res.CopyFrom(this);
  res.Storage() *= alpha;
}